

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_parser_t * mpca_grammar_st(char *grammar,mpca_grammar_st_t *st)

{
  mpca_grammar_st_t *pmVar1;
  int iVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  mpc_parser_t *pmVar5;
  mpc_parser_t *pmVar6;
  mpc_parser_t *pmVar7;
  mpc_parser_t *pmVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  mpc_input_t *i;
  char *__ptr;
  mpc_result_t mVar13;
  mpc_result_t r;
  mpc_result_t local_70;
  mpc_parser_t *local_68;
  mpca_grammar_st_t *local_60;
  mpc_parser_t *local_58;
  mpc_parser_t *local_50;
  mpc_parser_t *local_48;
  mpc_parser_t *local_40;
  char *local_38;
  
  local_60 = st;
  local_38 = grammar;
  pmVar3 = mpc_new("grammar_total");
  local_40 = pmVar3;
  pmVar4 = mpc_new("grammar");
  pmVar5 = mpc_new("term");
  pmVar6 = mpc_new("factor");
  local_68 = mpc_new("base");
  pmVar7 = mpc_strip(pmVar4);
  pmVar7 = mpc_whole(pmVar7,mpc_soft_delete);
  pmVar8 = (mpc_parser_t *)calloc(1,0x38);
  pmVar8->type = '\x11';
  (pmVar8->data).expect.x = pmVar7;
  mpc_define(pmVar3,pmVar8);
  pmVar3 = mpc_sym("|");
  local_48 = pmVar4;
  pmVar3 = mpc_and(2,mpcf_snd_free,pmVar3,pmVar4,free);
  pvVar9 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar9 + 0x30) = 0x13;
  *(mpc_parser_t **)((long)pvVar9 + 8) = pmVar3;
  *(code **)((long)pvVar9 + 0x18) = mpcf_ctor_null;
  local_50 = pmVar5;
  pmVar3 = mpc_and(2,mpcaf_grammar_or,pmVar5,pvVar9,mpc_soft_delete);
  mpc_define(pmVar4,pmVar3);
  pmVar3 = (mpc_parser_t *)calloc(1,0x38);
  pmVar3->type = '\x15';
  (pmVar3->data).repeat.x = pmVar6;
  (pmVar3->data).apply.f = mpcaf_grammar_and;
  local_58 = pmVar6;
  mpc_define(pmVar5,pmVar3);
  pmVar3 = mpc_sym("*");
  pmVar4 = mpc_sym("+");
  pmVar5 = mpc_sym("?");
  pmVar7 = mpc_sym("!");
  pmVar8 = mpc_int();
  pmVar8 = mpc_tok_between(pmVar8,free,"{","}");
  pvVar9 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar9 + 0x30) = 1;
  pmVar3 = mpc_or(6,pmVar3,pmVar4,pmVar5,pmVar7,pmVar8,pvVar9);
  pmVar3 = mpc_and(2,mpcaf_grammar_repeat,local_68,pmVar3,mpc_soft_delete);
  mpc_define(pmVar6,pmVar3);
  pmVar3 = mpc_string_lit();
  pmVar4 = mpc_blank();
  pmVar3 = mpc_and(2,mpcf_fst,pmVar3,pmVar4,mpcf_dtor_null);
  pvVar9 = calloc(1,0x38);
  pmVar1 = local_60;
  *(undefined1 *)((long)pvVar9 + 0x30) = 0x10;
  *(mpc_parser_t **)((long)pvVar9 + 8) = pmVar3;
  *(code **)((long)pvVar9 + 0x10) = mpcaf_grammar_string;
  *(mpca_grammar_st_t **)((long)pvVar9 + 0x18) = local_60;
  pmVar3 = mpc_char_lit();
  pmVar4 = mpc_blank();
  pmVar3 = mpc_and(2,mpcf_fst,pmVar3,pmVar4,mpcf_dtor_null);
  pvVar10 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar10 + 0x30) = 0x10;
  *(mpc_parser_t **)((long)pvVar10 + 8) = pmVar3;
  *(code **)((long)pvVar10 + 0x10) = mpcaf_grammar_char;
  *(mpca_grammar_st_t **)((long)pvVar10 + 0x18) = pmVar1;
  pmVar3 = mpc_regex_lit();
  pmVar4 = mpc_oneof("ms");
  pvVar11 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar11 + 0x30) = 0x14;
  *(mpc_parser_t **)((long)pvVar11 + 0x18) = pmVar4;
  *(code **)((long)pvVar11 + 0x10) = mpcf_strfold;
  pvVar12 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar12 + 0x30) = 4;
  *(mpca_grammar_st_t **)((long)pvVar12 + 0x10) = pmVar1;
  pmVar3 = mpc_and(3,mpcaf_fold_regex,pmVar3,pvVar11,pvVar12,free,free);
  pmVar4 = mpc_blank();
  pmVar3 = mpc_and(2,mpcf_fst,pmVar3,pmVar4,mpcf_dtor_null);
  pmVar4 = mpc_digits();
  pmVar5 = mpc_ident();
  pmVar4 = mpc_or(2,pmVar4,pmVar5);
  pmVar4 = mpc_tok_between(pmVar4,free,"<",">");
  pvVar11 = calloc(1,0x38);
  pmVar6 = local_48;
  *(undefined1 *)((long)pvVar11 + 0x30) = 0x10;
  *(mpc_parser_t **)((long)pvVar11 + 8) = pmVar4;
  *(code **)((long)pvVar11 + 0x10) = mpcaf_grammar_id;
  *(mpca_grammar_st_t **)((long)pvVar11 + 0x18) = pmVar1;
  pmVar8 = mpc_tok_between(local_48,mpc_soft_delete,"(",")");
  pmVar7 = local_40;
  pmVar5 = local_50;
  pmVar4 = local_58;
  pmVar8 = mpc_or(5,pvVar9,pvVar10,pmVar3,pvVar11,pmVar8);
  pmVar3 = local_68;
  mpc_define(local_68,pmVar8);
  mpc_optimise_unretained(pmVar7,1);
  mpc_optimise_unretained(pmVar6,1);
  mpc_optimise_unretained(pmVar4,1);
  mpc_optimise_unretained(pmVar5,1);
  mpc_optimise_unretained(pmVar3,1);
  i = mpc_input_new_string("<mpc_grammar_compiler>",local_38);
  iVar2 = mpc_parse_input(i,pmVar7,&local_70);
  mpc_input_delete(i);
  if (iVar2 == 0) {
    __ptr = mpc_err_string(local_70.error);
    mVar13.error = (mpc_err_t *)mpc_failf("Invalid Grammar: %s",__ptr);
    mpc_err_delete(local_70.error);
    free(__ptr);
    local_70.error = mVar13.error;
  }
  mpc_cleanup(5,pmVar7,pmVar6,pmVar5,pmVar4,local_68);
  mpc_optimise_unretained((mpc_parser_t *)local_70.error,1);
  mVar13 = local_70;
  if ((local_60->flags & 1) != 0) {
    local_70.output = calloc(1,0x38);
    *(char *)&(local_70.error)->failure = '\x11';
    (((mpc_pdata_t *)&((local_70.error)->state).row)->expect).x = (mpc_parser_t *)mVar13;
  }
  return (mpc_parser_t *)local_70.error;
}

Assistant:

mpc_parser_t *mpca_grammar_st(const char *grammar, mpca_grammar_st_t *st) {

  char *err_msg;
  mpc_parser_t *err_out;
  mpc_result_t r;
  mpc_parser_t *GrammarTotal, *Grammar, *Term, *Factor, *Base;

  GrammarTotal = mpc_new("grammar_total");
  Grammar = mpc_new("grammar");
  Term = mpc_new("term");
  Factor = mpc_new("factor");
  Base = mpc_new("base");

  mpc_define(GrammarTotal,
    mpc_predictive(mpc_total(Grammar, mpc_soft_delete))
  );

  mpc_define(Grammar, mpc_and(2, mpcaf_grammar_or,
    Term,
    mpc_maybe(mpc_and(2, mpcf_snd_free, mpc_sym("|"), Grammar, free)),
    mpc_soft_delete
  ));

  mpc_define(Term, mpc_many1(mpcaf_grammar_and, Factor));

  mpc_define(Factor, mpc_and(2, mpcaf_grammar_repeat,
    Base,
      mpc_or(6,
        mpc_sym("*"),
        mpc_sym("+"),
        mpc_sym("?"),
        mpc_sym("!"),
        mpc_tok_brackets(mpc_int(), free),
        mpc_pass()),
    mpc_soft_delete
  ));

  mpc_define(Base, mpc_or(5,
    mpc_apply_to(mpc_tok(mpc_string_lit()), mpcaf_grammar_string, st),
    mpc_apply_to(mpc_tok(mpc_char_lit()),   mpcaf_grammar_char, st),
    mpc_tok(mpc_and(3, mpcaf_fold_regex, mpc_regex_lit(), mpc_many(mpcf_strfold, mpc_oneof("ms")), mpc_lift_val(st), free, free)),
    mpc_apply_to(mpc_tok_braces(mpc_or(2, mpc_digits(), mpc_ident()), free), mpcaf_grammar_id, st),
    mpc_tok_parens(Grammar, mpc_soft_delete)
  ));

  mpc_optimise(GrammarTotal);
  mpc_optimise(Grammar);
  mpc_optimise(Factor);
  mpc_optimise(Term);
  mpc_optimise(Base);

  if(!mpc_parse("<mpc_grammar_compiler>", grammar, GrammarTotal, &r)) {
    err_msg = mpc_err_string(r.error);
    err_out = mpc_failf("Invalid Grammar: %s", err_msg);
    mpc_err_delete(r.error);
    free(err_msg);
    r.output = err_out;
  }

  mpc_cleanup(5, GrammarTotal, Grammar, Term, Factor, Base);

  mpc_optimise(r.output);

  return (st->flags & MPCA_LANG_PREDICTIVE) ? mpc_predictive(r.output) : r.output;

}